

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int32 *piVar2;
  int32 *piVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  uint32 i;
  uint32 uVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  uint32 *puVar11;
  byte bVar12;
  uint in_ECX;
  ulong uVar13;
  uint uVar14;
  long in_RDX;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint32 num_codes [17];
  uint32 min_codes [16];
  uint32 sorted_positions [17];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  uint auStack_bc [35];
  
  uVar16 = (uint)ctx;
  if (0xb < in_ECX || uVar16 == 0) {
    return 0;
  }
  this->m_num_syms = uVar16;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_c8 = 0;
  uVar8 = 0;
  do {
    if ((ulong)*(byte *)(in_RDX + uVar8) != 0) {
      *(int *)(local_108 + (ulong)*(byte *)(in_RDX + uVar8) * 4) =
           *(int *)(local_108 + (ulong)*(byte *)(in_RDX + uVar8) * 4) + 1;
    }
    uVar8 = uVar8 + 1;
  } while (((ulong)ctx & 0xffffffff) != uVar8);
  uVar18 = 0xffffffff;
  lVar9 = 0;
  bVar12 = 0xf;
  uVar14 = 0;
  uVar17 = 0;
  uVar15 = 0;
  do {
    iVar20 = *(int *)(local_108 + lVar9 * 4 + 4);
    if (iVar20 == 0) {
      this->m_max_codes[lVar9] = 0;
    }
    else {
      uVar19 = (int)lVar9 + 1;
      if (uVar19 <= uVar18) {
        uVar18 = uVar19;
      }
      if (uVar15 <= uVar19) {
        uVar15 = uVar19;
      }
      iVar1 = iVar20 + uVar14;
      auStack_bc[lVar9 + 1] = uVar14;
      uVar14 = uVar14 + iVar20;
      this->m_max_codes[lVar9] = (~(-1 << (bVar12 & 0x1f)) | iVar1 + -1 << (bVar12 & 0x1f)) + 1;
      this->m_val_ptrs[lVar9] = uVar17;
      auStack_bc[lVar9 + 0x12] = uVar17;
      uVar17 = iVar20 + uVar17;
    }
    uVar14 = uVar14 * 2;
    bVar12 = bVar12 - 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  this->m_total_used_syms = uVar17;
  if (this->m_cur_sorted_symbol_order_size < uVar17) {
    uVar14 = uVar17 - 1;
    if (((uVar17 & uVar14) != 0) &&
       (uVar14 = uVar14 >> 0x10 | uVar14, uVar14 = uVar14 >> 8 | uVar14,
       uVar14 = uVar14 >> 4 | uVar14, uVar14 = uVar14 >> 2 | uVar14,
       uVar17 = (uVar14 >> 1 | uVar14) + 1, uVar16 < uVar17)) {
      uVar17 = uVar16;
    }
    this->m_cur_sorted_symbol_order_size = uVar17;
    if (this->m_sorted_symbol_order != (uint16 *)0x0) {
      crnd_free(this->m_sorted_symbol_order + -4);
      uVar17 = this->m_cur_sorted_symbol_order_size;
    }
    uVar17 = uVar17 + (uVar17 == 0);
    puVar10 = (uint *)crnd_malloc((ulong)uVar17 * 2 + 8,(size_t *)0x0);
    if (puVar10 == (uint *)0x0) {
      this->m_sorted_symbol_order = (uint16 *)0x0;
      return 0;
    }
    puVar10[1] = uVar17;
    *puVar10 = ~uVar17;
    this->m_sorted_symbol_order = (uint16 *)(puVar10 + 2);
  }
  this->m_min_code_size = (uint8)uVar18;
  this->m_max_code_size = (uint8)uVar15;
  uVar8 = 0;
  do {
    uVar13 = (ulong)*(byte *)(in_RDX + uVar8);
    if (uVar13 != 0) {
      uVar16 = auStack_bc[uVar13 + 0x11];
      auStack_bc[uVar13 + 0x11] = uVar16 + 1;
      this->m_sorted_symbol_order[uVar16] = (uint16)uVar8;
    }
    uVar8 = uVar8 + 1;
  } while (((ulong)ctx & 0xffffffff) != uVar8);
  uVar17 = (uint)this->m_min_code_size;
  uVar16 = 0;
  if (uVar17 < in_ECX) {
    uVar16 = in_ECX;
  }
  this->m_table_bits = uVar16;
  if (uVar17 < in_ECX) {
    bVar12 = (byte)in_ECX;
    uVar14 = 1 << (bVar12 & 0x1f);
    if (this->m_cur_lookup_size < uVar14) {
      this->m_cur_lookup_size = uVar14;
      if (this->m_lookup != (uint32 *)0x0) {
        crnd_free(this->m_lookup + -2);
      }
      puVar10 = (uint *)crnd_malloc((ulong)((4 << (bVar12 & 0x1f)) + 8),(size_t *)0x0);
      if (puVar10 == (uint *)0x0) {
        this->m_lookup = (uint32 *)0x0;
        return 0;
      }
      puVar11 = puVar10 + 2;
      puVar10[1] = uVar14;
      *puVar10 = ~uVar14;
      this->m_lookup = puVar11;
    }
    else {
      puVar11 = this->m_lookup;
    }
    memset(puVar11,0xff,4L << (bVar12 & 0x3f));
    uVar8 = 1;
    do {
      if (*(int *)(local_108 + uVar8 * 4) != 0) {
        uVar7 = this->m_max_codes[uVar8 - 1];
        uVar18 = uVar7 - 1 >> (0x10U - (char)uVar8 & 0x1f);
        uVar14 = auStack_bc[uVar8];
        if ((uVar7 == 0) || (uVar14 <= uVar18)) {
          iVar20 = this->m_max_codes[uVar8 + 0x10] - uVar14;
          bVar12 = (char)uVar16 - (char)uVar8;
          do {
            uVar4 = this->m_sorted_symbol_order[iVar20 + uVar14];
            uVar19 = 1;
            do {
              this->m_lookup[((uVar14 << (bVar12 & 0x1f)) + uVar19) - 1] =
                   (uint)uVar4 | (int)uVar8 << 0x10;
              uVar5 = uVar19 >> (bVar12 & 0x1f);
              uVar19 = uVar19 + 1;
            } while (uVar5 == 0);
            uVar14 = uVar14 + 1;
          } while ((uVar7 == 0) || (uVar14 <= uVar18));
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != in_ECX + 1);
  }
  lVar9 = 0;
  do {
    piVar2 = this->m_val_ptrs + lVar9;
    iVar20 = piVar2[1];
    iVar1 = piVar2[2];
    iVar6 = piVar2[3];
    uVar14 = auStack_bc[lVar9 + 2];
    uVar18 = auStack_bc[lVar9 + 3];
    uVar19 = auStack_bc[lVar9 + 4];
    piVar3 = this->m_val_ptrs + lVar9;
    *piVar3 = *piVar2 - auStack_bc[lVar9 + 1];
    piVar3[1] = iVar20 - uVar14;
    piVar3[2] = iVar1 - uVar18;
    piVar3[3] = iVar6 - uVar19;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x10);
  this->m_table_max_code = 0;
  this->m_decode_start_code_size = (uint)this->m_min_code_size;
  if (uVar17 < in_ECX) {
    puVar11 = this->m_max_codes + (in_ECX - 1);
    do {
      if (*(int *)(local_108 + (ulong)in_ECX * 4) != 0) {
        this->m_table_max_code = *puVar11;
        uVar17 = uVar16 + 1;
        this->m_decode_start_code_size = uVar17;
        if (uVar16 < uVar15) goto LAB_001123e8;
        break;
      }
      in_ECX = in_ECX - 1;
      puVar11 = puVar11 + -1;
    } while (in_ECX != 0);
  }
  goto LAB_0011240c;
  while (uVar17 = uVar17 + 1, uVar17 <= uVar15) {
LAB_001123e8:
    if (*(int *)(local_108 + (ulong)uVar17 * 4) != 0) {
      this->m_decode_start_code_size = uVar17;
      break;
    }
  }
LAB_0011240c:
  this->m_max_codes[0x10] = 0xffffffff;
  this->m_val_ptrs[0x10] = 0xfffff;
  uVar7 = 0x20 - this->m_table_bits;
  this->m_table_shift = uVar7;
  return (int)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits) {
  uint32 min_codes[cMaxExpectedCodeSize];
  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  m_num_syms = num_syms;

  uint32 num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint32 sorted_positions[cMaxExpectedCodeSize + 1];

  uint32 cur_code = 0;

  uint32 total_used_syms = 0;
  uint32 max_code_size = 0;
  uint32 min_code_size = cUINT32_MAX;
  for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint32 n = num_codes[i];

    if (!n)
      m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = cur_code;

      m_max_codes[i - 1] = cur_code + n - 1;
      m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      cur_code += n;
      total_used_syms += n;
    }

    cur_code <<= 1;
  }

  m_total_used_syms = total_used_syms;

  if (total_used_syms > m_cur_sorted_symbol_order_size) {
    m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

    if (m_sorted_symbol_order)
      crnd_delete_array(m_sorted_symbol_order);

    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
    if (!m_sorted_symbol_order)
      return false;
  }

  m_min_code_size = static_cast<uint8>(min_code_size);
  m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c) {
      CRND_ASSERT(num_codes[c]);

      uint32 sorted_pos = sorted_positions[c]++;

      CRND_ASSERT(sorted_pos < total_used_syms);

      m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= m_min_code_size)
    table_bits = 0;
  m_table_bits = table_bits;

  if (table_bits) {
    uint32 table_size = 1 << table_bits;
    if (table_size > m_cur_lookup_size) {
      m_cur_lookup_size = table_size;

      if (m_lookup)
        crnd_delete_array(m_lookup);

      m_lookup = crnd_new_array<uint32>(table_size);
      if (!m_lookup)
        return false;
    }

    memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

    for (uint32 codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint32 fillsize = table_bits - codesize;
      const uint32 fillnum = 1 << fillsize;

      const uint32 min_code = min_codes[codesize - 1];
      const uint32 max_code = get_unshifted_max_code(codesize);
      const uint32 val_ptr = m_val_ptrs[codesize - 1];

      for (uint32 code = min_code; code <= max_code; code++) {
        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
        CRND_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint32 j = 0; j < fillnum; j++) {
          const uint32 t = j + (code << fillsize);

          CRND_ASSERT(t < (1U << table_bits));

          CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

          m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
    m_val_ptrs[i] -= min_codes[i];

  m_table_max_code = 0;
  m_decode_start_code_size = m_min_code_size;

  if (table_bits) {
    uint32 i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        m_table_max_code = m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      m_decode_start_code_size = table_bits + 1;
      for (uint32 j = table_bits + 1; j <= max_code_size; j++) {
        if (num_codes[j]) {
          m_decode_start_code_size = j;
          break;
        }
      }
    }
  }

  // sentinels
  m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
  m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  m_table_shift = 32 - m_table_bits;
  return true;
}